

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O2

void prf_messages_post_va(int type,int level,__va_list_tag *args)

{
  prf_msg_handler_t *ppVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  char string [256];
  
  uVar3 = prf_array_count(prf_handlers[type]);
  uVar6 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar6;
  }
  bVar2 = false;
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    if ((prf_handlers[type][uVar6] != (prf_msg_handler_t *)0x0) &&
       (prf_handlers[type][uVar6]->level <= level)) {
      bVar2 = true;
    }
  }
  if (bVar2) {
    uVar3 = args->gp_offset;
    if ((ulong)uVar3 < 0x29) {
      puVar5 = (undefined8 *)((ulong)uVar3 + (long)args->reg_save_area);
      args->gp_offset = uVar3 + 8;
    }
    else {
      puVar5 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar5 + 1;
    }
    vsprintf(string,(char *)*puVar5,args);
    uVar3 = prf_array_count(prf_handlers[type]);
    uVar6 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar6;
    }
    for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      ppVar1 = prf_handlers[type][uVar6];
      if ((ppVar1 != (prf_msg_handler_t *)0x0) && (ppVar1->level <= level)) {
        (*ppVar1->func)(type,level,string,ppVar1->userdata);
      }
    }
  }
  return;
}

Assistant:

void
prf_messages_post_va(
    int type,
    int level,
    va_list args )
{
    bool_t present;
    int i, count;
    char string[ 256 ];
    assert( type > 0 && type < 6 );
    /* check that handler is present */
    present = FALSE;
    count = prf_array_count( prf_handlers[type] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[type][i] != NULL &&
             prf_handlers[type][i]->level <= level ) {
            present = TRUE;
        }
    }
    if ( present == FALSE ) {
        return;
    }
    /* build string */
    do {
        char * format;
        format = va_arg( args, char * );
        vsprintf( string, format, args );
    } while ( FALSE );

    /* call handlers with string */
    count = prf_array_count( prf_handlers[ type ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[type][i] != NULL &&
             prf_handlers[type][i]->level <= level ) {
            (*(prf_handlers[type][i]->func))( type, level, string,
                 prf_handlers[type][i]->userdata );
        }
    }
}